

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analyser.cpp
# Opt level: O1

bool __thiscall Analyser::analyse_variable_declaration(Analyser *this)

{
  ulong uVar1;
  pointer pTVar2;
  _Storage *p_Var3;
  bool bVar4;
  char cVar5;
  bool bVar6;
  int iVar7;
  long *plVar8;
  string *psVar9;
  long *plVar10;
  _Arg __arg;
  optional<Token> next;
  any local_1b8;
  undefined1 local_1a8 [32];
  char local_188;
  _Arg local_180;
  undefined1 local_178 [32];
  bool local_158;
  undefined1 *local_150;
  long local_148;
  undefined1 local_140 [16];
  undefined1 *local_130;
  long local_128;
  undefined1 local_120 [16];
  undefined1 *local_110;
  long local_108;
  undefined1 local_100 [16];
  undefined1 *local_f0;
  long local_e8;
  undefined1 local_e0 [16];
  undefined1 *local_d0;
  long local_c8;
  undefined1 local_c0 [16];
  undefined1 *local_b0;
  long local_a8;
  undefined1 local_a0 [16];
  undefined1 *local_90;
  long local_88;
  undefined1 local_80 [16];
  undefined1 *local_70;
  long local_68;
  undefined1 local_60 [16];
  undefined1 *local_50;
  long local_48;
  undefined1 local_40 [16];
  
  nextToken((optional<Token> *)local_178,this);
  bVar4 = (bool)(local_178._0_4_ == RESERVED_WORD & local_158);
  if (bVar4 == false) {
    uVar1 = this->_offset;
    if (uVar1 != 0) {
      pTVar2 = (this->_tokens).super__Vector_base<Token,_std::allocator<Token>_>._M_impl.
               super__Vector_impl_data._M_start;
      if (uVar1 < (ulong)((long)(this->_tokens).super__Vector_base<Token,_std::allocator<Token>_>.
                                _M_impl.super__Vector_impl_data._M_finish - (long)pTVar2 >> 5)) {
        this->_currentLine = (int32_t)pTVar2[uVar1 - 1]._lineNumber;
      }
      this->_offset = uVar1 - 1;
    }
  }
  else {
    local_1b8._M_storage._M_ptr = (void *)0x0;
    if ((_func_void__Op_any_ptr__Arg_ptr *)local_178._8_8_ == (_func_void__Op_any_ptr__Arg_ptr *)0x0
       ) {
      local_1b8._M_manager = (_func_void__Op_any_ptr__Arg_ptr *)0x0;
    }
    else {
      local_180._M_obj = &local_1b8;
      (*(code *)local_178._8_8_)(_Op_clone,(any *)(local_178 + 8),&local_180);
    }
    plVar8 = (long *)std::__any_caster<std::__cxx11::string>(&local_1b8);
    if (plVar8 == (long *)0x0) {
      std::__throw_bad_any_cast();
    }
    p_Var3 = &(((_Storage<Token,_false> *)local_1a8)->_M_value)._value._M_storage;
    plVar10 = plVar8 + 2;
    if ((_Storage *)*plVar8 == (_Storage *)plVar10) {
      local_1a8._16_8_ = *plVar10;
      local_1a8._24_8_ = plVar8[3];
      local_1a8._0_8_ = p_Var3;
    }
    else {
      local_1a8._16_8_ = *plVar10;
      local_1a8._0_8_ = (_Storage *)*plVar8;
    }
    local_1a8._8_8_ = plVar8[1];
    *plVar8 = (long)plVar10;
    plVar8[1] = 0;
    *(undefined1 *)(plVar8 + 2) = 0;
    iVar7 = std::__cxx11::string::compare((char *)local_1a8);
    if ((_Storage *)local_1a8._0_8_ != p_Var3) {
      operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
    }
    if (local_1b8._M_manager != (_func_void__Op_any_ptr__Arg_ptr *)0x0) {
      (*local_1b8._M_manager)(_Op_destroy,&local_1b8,(_Arg *)0x0);
      local_1b8._M_manager = (_func_void__Op_any_ptr__Arg_ptr *)0x0;
    }
    if (iVar7 == 0) {
      cVar5 = analyse_type_specifier(this);
      if (cVar5 == 'v') {
        psVar9 = (string *)__cxa_allocate_exception(0x28);
        local_50 = local_40;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_50,"can not identify a \'void\' variable","");
        iVar7 = this->_currentLine;
        *(string **)psVar9 = psVar9 + 0x10;
        std::__cxx11::string::_M_construct<char*>(psVar9,local_50,local_50 + local_48);
        *(long *)(psVar9 + 0x20) = (long)iVar7;
        __cxa_throw(psVar9,&Error::typeinfo,Error::~Error);
      }
      do {
        nextToken((optional<Token> *)&((_Storage<Token,_false> *)local_1a8)->_M_value,this);
        std::_Optional_payload_base<Token>::_M_move_assign
                  ((_Optional_payload_base<Token> *)local_178,
                   (_Optional_payload_base<Token> *)&((_Storage<Token,_false> *)local_1a8)->_M_value
                  );
        if (local_188 == '\x01') {
          std::_Optional_payload_base<Token>::_M_destroy
                    ((_Optional_payload_base<Token> *)
                     &((_Storage<Token,_false> *)local_1a8)->_M_value);
        }
        if ((local_158 != true) || (local_178._0_4_ != IDENTIFIER)) {
          psVar9 = (string *)__cxa_allocate_exception(0x28);
          local_70 = local_60;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_70,"Missing < init - declarator - list>","");
          iVar7 = this->_currentLine;
          *(string **)psVar9 = psVar9 + 0x10;
          std::__cxx11::string::_M_construct<char*>(psVar9,local_70,local_70 + local_68);
          *(long *)(psVar9 + 0x20) = (long)iVar7;
          __cxa_throw(psVar9,&Error::typeinfo,Error::~Error);
        }
        local_1b8._M_storage._M_ptr = (void *)0x0;
        if ((_func_void__Op_any_ptr__Arg_ptr *)local_178._8_8_ ==
            (_func_void__Op_any_ptr__Arg_ptr *)0x0) {
          local_1b8._M_manager = (_func_void__Op_any_ptr__Arg_ptr *)0x0;
        }
        else {
          local_180._M_obj = &local_1b8;
          (*(code *)local_178._8_8_)(_Op_clone,(any *)(local_178 + 8),&local_180);
        }
        plVar8 = (long *)std::__any_caster<std::__cxx11::string>(&local_1b8);
        if (plVar8 == (long *)0x0) {
          std::__throw_bad_any_cast();
        }
        plVar10 = plVar8 + 2;
        if ((_Storage *)*plVar8 == (_Storage *)plVar10) {
          local_1a8._16_8_ = *plVar10;
          local_1a8._24_8_ = plVar8[3];
          local_1a8._0_8_ = p_Var3;
        }
        else {
          local_1a8._16_8_ = *plVar10;
          local_1a8._0_8_ = (_Storage *)*plVar8;
        }
        local_1a8._8_8_ = plVar8[1];
        *plVar8 = (long)plVar10;
        plVar8[1] = 0;
        *(undefined1 *)(plVar8 + 2) = 0;
        addVariable(this,(string *)&((_Storage<Token,_false> *)local_1a8)->_M_value,true);
        if ((_Storage *)local_1a8._0_8_ != p_Var3) {
          operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
        }
        if (local_1b8._M_manager != (_func_void__Op_any_ptr__Arg_ptr *)0x0) {
          (*local_1b8._M_manager)(_Op_destroy,&local_1b8,(_Arg *)0x0);
          local_1b8._M_manager = (_func_void__Op_any_ptr__Arg_ptr *)0x0;
        }
        bVar6 = analyse_initializer(this,'\0');
        if (!bVar6) {
          psVar9 = (string *)__cxa_allocate_exception(0x28);
          local_90 = local_80;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_90,"Missing <initializer>","");
          iVar7 = this->_currentLine;
          *(string **)psVar9 = psVar9 + 0x10;
          std::__cxx11::string::_M_construct<char*>(psVar9,local_90,local_90 + local_88);
          *(long *)(psVar9 + 0x20) = (long)iVar7;
          __cxa_throw(psVar9,&Error::typeinfo,Error::~Error);
        }
        nextToken((optional<Token> *)&((_Storage<Token,_false> *)local_1a8)->_M_value,this);
        std::_Optional_payload_base<Token>::_M_move_assign
                  ((_Optional_payload_base<Token> *)local_178,
                   (_Optional_payload_base<Token> *)&((_Storage<Token,_false> *)local_1a8)->_M_value
                  );
        if (local_188 == '\x01') {
          std::_Optional_payload_base<Token>::_M_destroy
                    ((_Optional_payload_base<Token> *)
                     &((_Storage<Token,_false> *)local_1a8)->_M_value);
        }
        if (local_158 == false) {
          psVar9 = (string *)__cxa_allocate_exception(0x28);
          local_b0 = local_a0;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"Missing \';\'","");
          iVar7 = this->_currentLine;
          *(string **)psVar9 = psVar9 + 0x10;
          std::__cxx11::string::_M_construct<char*>(psVar9,local_b0,local_b0 + local_a8);
          *(long *)(psVar9 + 0x20) = (long)iVar7;
          __cxa_throw(psVar9,&Error::typeinfo,Error::~Error);
        }
      } while (local_178._0_4_ == COMMA_SIGH);
      if (local_178._0_4_ != SEMICOLON) {
        psVar9 = (string *)__cxa_allocate_exception(0x28);
        local_d0 = local_c0;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"Missing \';\'","");
        iVar7 = this->_currentLine;
        *(string **)psVar9 = psVar9 + 0x10;
        std::__cxx11::string::_M_construct<char*>(psVar9,local_d0,local_d0 + local_c8);
        *(long *)(psVar9 + 0x20) = (long)iVar7;
        __cxa_throw(psVar9,&Error::typeinfo,Error::~Error);
      }
    }
    else {
      uVar1 = this->_offset;
      if (uVar1 != 0) {
        pTVar2 = (this->_tokens).super__Vector_base<Token,_std::allocator<Token>_>._M_impl.
                 super__Vector_impl_data._M_start;
        if (uVar1 < (ulong)((long)(this->_tokens).super__Vector_base<Token,_std::allocator<Token>_>.
                                  _M_impl.super__Vector_impl_data._M_finish - (long)pTVar2 >> 5)) {
          this->_currentLine = (int32_t)pTVar2[uVar1 - 1]._lineNumber;
        }
        this->_offset = uVar1 - 1;
      }
      cVar5 = analyse_type_specifier(this);
      if (cVar5 == 'v') {
        psVar9 = (string *)__cxa_allocate_exception(0x28);
        local_f0 = local_e0;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_f0,"can not identify a \'void\' variable","");
        iVar7 = this->_currentLine;
        *(string **)psVar9 = psVar9 + 0x10;
        std::__cxx11::string::_M_construct<char*>(psVar9,local_f0,local_f0 + local_e8);
        *(long *)(psVar9 + 0x20) = (long)iVar7;
        __cxa_throw(psVar9,&Error::typeinfo,Error::~Error);
      }
      do {
        nextToken((optional<Token> *)&((_Storage<Token,_false> *)local_1a8)->_M_value,this);
        std::_Optional_payload_base<Token>::_M_move_assign
                  ((_Optional_payload_base<Token> *)local_178,
                   (_Optional_payload_base<Token> *)&((_Storage<Token,_false> *)local_1a8)->_M_value
                  );
        if (local_188 == '\x01') {
          std::_Optional_payload_base<Token>::_M_destroy
                    ((_Optional_payload_base<Token> *)
                     &((_Storage<Token,_false> *)local_1a8)->_M_value);
        }
        if ((local_158 != true) || (local_178._0_4_ != IDENTIFIER)) {
          psVar9 = (string *)__cxa_allocate_exception(0x28);
          local_110 = local_100;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_110,"Missing < init - declarator - list>","");
          iVar7 = this->_currentLine;
          *(string **)psVar9 = psVar9 + 0x10;
          std::__cxx11::string::_M_construct<char*>(psVar9,local_110,local_110 + local_108);
          *(long *)(psVar9 + 0x20) = (long)iVar7;
          __cxa_throw(psVar9,&Error::typeinfo,Error::~Error);
        }
        local_1b8._M_storage._M_ptr = (void *)0x0;
        if ((_func_void__Op_any_ptr__Arg_ptr *)local_178._8_8_ ==
            (_func_void__Op_any_ptr__Arg_ptr *)0x0) {
          local_1b8._M_manager = (_func_void__Op_any_ptr__Arg_ptr *)0x0;
        }
        else {
          local_180._M_obj = &local_1b8;
          (*(code *)local_178._8_8_)(_Op_clone,(any *)(local_178 + 8),&local_180);
        }
        plVar8 = (long *)std::__any_caster<std::__cxx11::string>(&local_1b8);
        if (plVar8 == (long *)0x0) {
          std::__throw_bad_any_cast();
        }
        plVar10 = plVar8 + 2;
        if ((_Storage *)*plVar8 == (_Storage *)plVar10) {
          local_1a8._16_8_ = *plVar10;
          local_1a8._24_8_ = plVar8[3];
          local_1a8._0_8_ = p_Var3;
        }
        else {
          local_1a8._16_8_ = *plVar10;
          local_1a8._0_8_ = (_Storage *)*plVar8;
        }
        local_1a8._8_8_ = plVar8[1];
        *plVar8 = (long)plVar10;
        plVar8[1] = 0;
        *(undefined1 *)(plVar8 + 2) = 0;
        addVariable(this,(string *)&((_Storage<Token,_false> *)local_1a8)->_M_value,false);
        if ((_Storage *)local_1a8._0_8_ != p_Var3) {
          operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
        }
        if (local_1b8._M_manager != (_func_void__Op_any_ptr__Arg_ptr *)0x0) {
          (*local_1b8._M_manager)(_Op_destroy,&local_1b8,(_Arg *)0x0);
          local_1b8._M_manager = (_func_void__Op_any_ptr__Arg_ptr *)0x0;
        }
        bVar6 = analyse_initializer(this,'\0');
        if (cVar5 == 'i' && !bVar6) {
          local_1a8._0_8_ = (_Storage *)0x0;
          local_1a8._8_8_ = (_func_void__Op_any_ptr__Arg_ptr *)0x100000000;
          addInstruction(this,(Instruction *)&((_Storage<Token,_false> *)local_1a8)->_M_value);
        }
        nextToken((optional<Token> *)&((_Storage<Token,_false> *)local_1a8)->_M_value,this);
        std::_Optional_payload_base<Token>::_M_move_assign
                  ((_Optional_payload_base<Token> *)local_178,
                   (_Optional_payload_base<Token> *)&((_Storage<Token,_false> *)local_1a8)->_M_value
                  );
        if (local_188 == '\x01') {
          std::_Optional_payload_base<Token>::_M_destroy
                    ((_Optional_payload_base<Token> *)
                     &((_Storage<Token,_false> *)local_1a8)->_M_value);
        }
        if (local_158 == false) {
          psVar9 = (string *)__cxa_allocate_exception(0x28);
          local_130 = local_120;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_130,"Missing \';\'","");
          iVar7 = this->_currentLine;
          *(string **)psVar9 = psVar9 + 0x10;
          std::__cxx11::string::_M_construct<char*>(psVar9,local_130,local_130 + local_128);
          *(long *)(psVar9 + 0x20) = (long)iVar7;
          __cxa_throw(psVar9,&Error::typeinfo,Error::~Error);
        }
      } while (local_178._0_4_ == COMMA_SIGH);
      if (local_178._0_4_ != SEMICOLON) {
        psVar9 = (string *)__cxa_allocate_exception(0x28);
        local_150 = local_140;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_150,"Missing \';\'","");
        iVar7 = this->_currentLine;
        *(string **)psVar9 = psVar9 + 0x10;
        std::__cxx11::string::_M_construct<char*>(psVar9,local_150,local_150 + local_148);
        *(long *)(psVar9 + 0x20) = (long)iVar7;
        __cxa_throw(psVar9,&Error::typeinfo,Error::~Error);
      }
    }
  }
  if (local_158 == true) {
    std::_Optional_payload_base<Token>::_M_destroy((_Optional_payload_base<Token> *)local_178);
  }
  return bVar4;
}

Assistant:

bool Analyser::analyse_variable_declaration() {
	auto next = nextToken();
	if (!next.has_value() || (next.value().GetType() != TokenType::RESERVED_WORD)) {
		unreadToken();
		return false;
	}
	//const
	if (std::any_cast<std::string>(next.value().GetValue()) == "const") {
		char type = analyse_type_specifier();
		if (type == 'v') {
			throw Error("can not identify a 'void' variable", _currentLine);
		}
		do {
			//init - declarator - list
			next = nextToken();
			if (!next.has_value() || (next.value().GetType() != TokenType::IDENTIFIER)) {
				throw Error("Missing < init - declarator - list>", _currentLine);
			}
			addVariable(std::any_cast<std::string>(next.value().GetValue()), true);
			bool has_initializer = analyse_initializer(type);
			if (!has_initializer) {
				throw Error("Missing <initializer>", _currentLine);
			}
			next = nextToken();
			if (!next.has_value()) {
				throw Error("Missing ';'", _currentLine);
			}
		} while (next.value().GetType() == TokenType::COMMA_SIGH);
		if (next.value().GetType() != TokenType::SEMICOLON) {
			throw Error("Missing ';'", _currentLine);
		}
		return true;
	}
	//non-const
	else {
		unreadToken();
		char type = analyse_type_specifier();
		if (type == 'v') {
			throw Error("can not identify a 'void' variable", _currentLine);
		}
		do {
			////init - declarator - list
			next = nextToken();
			if (!next.has_value() || (next.value().GetType() != TokenType::IDENTIFIER)) {
				throw Error("Missing < init - declarator - list>", _currentLine);
			}
			addVariable(std::any_cast<std::string>(next.value().GetValue()), false);
			bool has_initializer = analyse_initializer(type);
			if (!has_initializer) {
				initializeVariable(type);
			}
			next = nextToken();
			if (!next.has_value()) {
				throw Error("Missing ';'", _currentLine);
			}
		} while (next.value().GetType() == TokenType::COMMA_SIGH);
		if (next.value().GetType() != TokenType::SEMICOLON) {
			throw Error("Missing ';'", _currentLine);
		}
		return true;
	}
}